

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromise_p.h
# Opt level: O0

void __thiscall
QtPromisePrivate::
PromiseDataBase<std::__cxx11::list<QtPromise::QPromise<int>,_std::allocator<QtPromise::QPromise<int>_>_>,_void_(const_std::__cxx11::list<QtPromise::QPromise<int>,_std::allocator<QtPromise::QPromise<int>_>_>_&)>
::addCatcher(PromiseDataBase<std::__cxx11::list<QtPromise::QPromise<int>,_std::allocator<QtPromise::QPromise<int>_>_>,_void_(const_std::__cxx11::list<QtPromise::QPromise<int>,_std::allocator<QtPromise::QPromise<int>_>_>_&)>
             *this,function<void_(const_QtPromisePrivate::PromiseError_&)> *catcher)

{
  QThread *local_58;
  pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> local_50;
  QWriteLocker local_20;
  QWriteLocker lock;
  function<void_(const_QtPromisePrivate::PromiseError_&)> *catcher_local;
  PromiseDataBase<std::__cxx11::list<QtPromise::QPromise<int>,_std::allocator<QtPromise::QPromise<int>_>_>,_void_(const_std::__cxx11::list<QtPromise::QPromise<int>,_std::allocator<QtPromise::QPromise<int>_>_>_&)>
  *this_local;
  
  lock.q_val = (quintptr)catcher;
  QWriteLocker::QWriteLocker(&local_20,&this->m_lock);
  local_58 = (QThread *)QThread::currentThread();
  std::pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_>::
  pair<QThread_*,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>,_true>
            (&local_50,&local_58,catcher);
  QList<std::pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_>_>
  ::append(&this->m_catchers,&local_50);
  std::pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_>::~pair
            (&local_50);
  QWriteLocker::~QWriteLocker(&local_20);
  return;
}

Assistant:

void addCatcher(std::function<void(const PromiseError&)> catcher)
    {
        QWriteLocker lock{&m_lock};
        m_catchers.append({QThread::currentThread(), std::move(catcher)});
    }